

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

PCSTR TagToStringCxx(int tag)

{
  uint uVar1;
  char *pcStack_10;
  int tag_local;
  
  uVar1 = tag & 0xff;
  if (uVar1 == 0) {
    pcStack_10 = "void";
  }
  else if (uVar1 == 1) {
    pcStack_10 = "bool";
  }
  else if (uVar1 == 2) {
    pcStack_10 = "void*";
  }
  else if (uVar1 == 0x40) {
    pcStack_10 = "void";
  }
  else if (uVar1 == 0x7c) {
    pcStack_10 = "double";
  }
  else if (uVar1 == 0x7d) {
    pcStack_10 = "float";
  }
  else if (uVar1 == 0x7e) {
    pcStack_10 = "int64_t";
  }
  else if (uVar1 == 0x7f) {
    pcStack_10 = "int";
  }
  else if (uVar1 == 0x80) {
    pcStack_10 = "Value";
  }
  else if (uVar1 == 0x81) {
    pcStack_10 = "Label";
  }
  else if (uVar1 == 0x82) {
    pcStack_10 = "Frame";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

PCSTR TagToStringCxx (int tag)
{
    switch ((w3Tag)tag)
    {
    default:break;
    case Tag_none:     return "void";
    case Tag_bool:     return "bool";
    case Tag_any:      return "void*"; // union?
    case Tag_i32:      return "int";
    case Tag_i64:      return "int64_t";
    case Tag_f32:      return "float";
    case Tag_f64:      return "double";
    case Tag_empty:    return "void";
    case Tag_Value:    return "Value";
    case Tag_Label:    return "Label";
    case Tag_Frame:    return "Frame";
    }
    return "unknown";
}